

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cc
# Opt level: O1

double __thiscall
calculator::ExpressionTree::calcValue(ExpressionTree *this,node *x,node *y,Tag tag)

{
  _Any_data *p_Var1;
  long lVar2;
  SyntaxError *this_00;
  ShiftNegativeException *this_01;
  DivZeroException *this_02;
  ulong uVar3;
  pointer_____offset_0x10___ *ppuVar4;
  double dVar5;
  key_type local_60;
  double local_40;
  double local_38;
  double local_30;
  
  if ((x == (node *)0x0) || (y == (node *)0x0)) {
    this_00 = (SyntaxError *)__cxa_allocate_exception(0x28);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"need two operator numbers","");
    SyntaxError::SyntaxError(this_00,&local_60);
    __cxa_throw(this_00,&SyntaxError::typeinfo,SyntaxError::~SyntaxError);
  }
  dVar5 = 0.0;
  switch(tag) {
  case And:
    uVar3 = (long)y->value & (long)x->value;
    goto LAB_00109aa1;
  case Or:
    uVar3 = (long)y->value | (long)x->value;
    goto LAB_00109aa1;
  case Xor:
    uVar3 = (long)y->value ^ (long)x->value;
LAB_00109aa1:
    dVar5 = (double)(long)uVar3;
    break;
  case Add:
    dVar5 = x->value + y->value;
    break;
  case Sub:
    dVar5 = x->value - y->value;
    break;
  case Mul:
    dVar5 = x->value * y->value;
    break;
  case Div:
    if (((y->type == Number) && (y->value == 0.0)) && (!NAN(y->value))) {
      this_02 = (DivZeroException *)__cxa_allocate_exception(0x28);
      DivZeroException::DivZeroException(this_02,x->value,(int)y->value);
      __cxa_throw(this_02,&DivZeroException::typeinfo,SyntaxError::~SyntaxError);
    }
    dVar5 = x->value / y->value;
    break;
  case Mod:
    dVar5 = fmod(x->value,y->value);
    return dVar5;
  case ShiftLeft:
    if ((x->type == Float) || (y->type == Float)) {
      this_01 = (ShiftNegativeException *)__cxa_allocate_exception(0x28);
      ShiftLeftRightException::ShiftLeftRightException((ShiftLeftRightException *)this_01);
LAB_00109bf5:
      ppuVar4 = &ShiftLeftRightException::typeinfo;
      goto LAB_00109c36;
    }
    if (0.0 <= y->value) {
      lVar2 = (long)x->value << ((byte)(long)y->value & 0x3f);
LAB_00109b5e:
      return (double)lVar2;
    }
    this_01 = (ShiftNegativeException *)__cxa_allocate_exception(0x28);
    ShiftNegativeException::ShiftNegativeException(this_01);
    goto LAB_00109c2f;
  case ShiftRight:
    if ((x->type == Float) || (y->type == Float)) {
      this_01 = (ShiftNegativeException *)__cxa_allocate_exception(0x28);
      ShiftLeftRightException::ShiftLeftRightException((ShiftLeftRightException *)this_01);
      goto LAB_00109bf5;
    }
    if (0.0 <= y->value) {
      lVar2 = (long)x->value >> ((byte)(long)y->value & 0x3f);
      goto LAB_00109b5e;
    }
    goto LAB_00109c03;
  case Pow:
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"pow","");
    p_Var1 = (_Any_data *)
             std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double,_double)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double,_double)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double,_double)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double,_double)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&(this->lexer_).binary_functions,&local_60);
    local_30 = x->value;
    local_38 = y->value;
    if (*(long *)(p_Var1 + 1) != 0) {
      local_40 = (**(code **)(p_Var1->_M_pod_data + 0x18))(p_Var1,&local_30,&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p == &local_60.field_2) {
        return local_40;
      }
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      return local_40;
    }
    std::__throw_bad_function_call();
LAB_00109c03:
    this_01 = (ShiftNegativeException *)__cxa_allocate_exception(0x28);
    ShiftNegativeException::ShiftNegativeException(this_01);
LAB_00109c2f:
    ppuVar4 = &ShiftNegativeException::typeinfo;
LAB_00109c36:
    __cxa_throw(this_01,ppuVar4,SyntaxError::~SyntaxError);
  }
  return dVar5;
}

Assistant:

double ExpressionTree::calcValue(node *x, node *y, Tag tag) {
    if (y == nullptr || x == nullptr)
        throw SyntaxError("need two operator numbers");
    switch (tag) {
        case Tag::Add:
            return x->value + y->value;
        case Tag::Sub:
            return x->value - y->value;
        case Tag::Mul:
            return x->value * y->value;
        case Tag::Div:
            if (y->type == Tag::Number && y->value == 0) {
                throw DivZeroException(x->value, y->value);
            }
            return x->value / y->value;
        case Tag::Mod:
            return fmod(x->value, y->value);
        case Tag::And:
            return (Integer)x->value & (Integer)y->value;
        case Tag::Or:
            return (Integer)x->value | (Integer)y->value;
        case Tag::Xor:
            return (Integer)x->value ^ (Integer)y->value;
        case Tag::ShiftLeft:
            // 左移或右移的操作数不能是浮点数
            if (x->type == Tag::Float || y->type == Tag::Float)
                throw ShiftLeftRightException();
            // 左移或右移的右操作数不能是负数
            if (y->value < 0) throw ShiftNegativeException();
            return (Integer)x->value << (Integer)y->value;
        case Tag::ShiftRight:
            if (x->type == Tag::Float || y->type == Tag::Float)
                throw ShiftLeftRightException();
            if (y->value < 0) throw ShiftNegativeException();
            return (Integer)x->value >> (Integer)y->value;
        case Tag::Pow:
            return lexer_.binary_functions["pow"](x->value, y->value);
        default:
            break;
    }
    return 0;
}